

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

string * __thiscall
google::protobuf::FieldDescriptor::DefaultValueAsString_abi_cxx11_
          (string *__return_storage_ptr__,FieldDescriptor *this,bool quote_string_type)

{
  byte bVar1;
  bool bVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined2 uVar5;
  undefined4 uVar6;
  string *this_00;
  char *pcVar7;
  EnumValueDescriptor *pEVar8;
  char *pcVar9;
  AlphaNum *in_R8;
  string_view str;
  string_view str_00;
  string_view src;
  string_view src_00;
  LogMessage local_d8;
  char local_c8 [32];
  string local_a8;
  AlphaNum local_88;
  AlphaNum local_58;
  
  if ((this->field_0x1 & 1) == 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_d8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
               ,0xc0a,"has_default_value()");
    str_00._M_str = "No default value";
    str_00._M_len = 0x10;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
              (&local_d8,str_00);
LAB_003930a4:
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_d8);
  }
  bVar1 = this->type_;
  switch(*(undefined4 *)(kTypeToCppTypeMap + (ulong)bVar1 * 4)) {
  case 1:
    pcVar7 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                       ((this->field_20).default_value_int32_t_,local_c8);
    break;
  case 2:
    pcVar7 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                       ((this->field_20).default_value_int64_t_,local_c8);
    break;
  case 3:
    pcVar7 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                       ((this->field_20).default_value_uint32_t_,local_c8);
    break;
  case 4:
    pcVar7 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                       ((this->field_20).default_value_uint64_t_,local_c8);
    break;
  case 5:
    io::SimpleDtoa_abi_cxx11_
              (__return_storage_ptr__,(io *)this,(this->field_20).default_value_double_);
    return __return_storage_ptr__;
  case 6:
    io::SimpleFtoa_abi_cxx11_
              (__return_storage_ptr__,(io *)this,(this->field_20).default_value_float_);
    return __return_storage_ptr__;
  case 7:
    bVar2 = (this->field_20).default_value_bool_;
    pcVar9 = "false";
    if ((ulong)bVar2 != 0) {
      pcVar9 = "true";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = (char *)((long)&(((LogMessageData *)pcVar9)->entry).full_filename_._M_len +
                     ((ulong)bVar2 ^ 5));
    goto LAB_00392f0a;
  case 8:
    pEVar8 = default_value_enum(this);
    pcVar9 = (pEVar8->all_names_->_M_dataplus)._M_p;
    pcVar7 = (char *)((long)&(((LogMessageData *)pcVar9)->entry).full_filename_._M_len +
                     pEVar8->all_names_->_M_string_length);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    goto LAB_00392f0a;
  case 9:
    if (quote_string_type) {
      local_d8.errno_saver_.saved_errno_ = 1;
      local_d8._4_4_ = 0;
      local_d8.data_._M_t.
      super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
      ._M_t.
      super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
      .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
      _M_head_impl = (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                      )((long)"\", \"" + 3);
      pEVar8 = (this->field_20).default_value_enum_;
      uVar3 = pEVar8->super_SymbolBaseN<0>;
      uVar4 = pEVar8->super_SymbolBaseN<1>;
      uVar5 = *(undefined2 *)&pEVar8->field_0x2;
      uVar6 = pEVar8->number_;
      src._M_len._4_4_ = uVar6;
      src._M_len._2_2_ = uVar5;
      src._M_len._1_1_ = uVar4;
      src._M_len._0_1_ = uVar3;
      src._M_str._0_1_ = bVar1;
      src._M_str._1_7_ = 0;
      absl::lts_20250127::CEscape_abi_cxx11_(&local_a8,(lts_20250127 *)pEVar8->all_names_,src);
      local_58.piece_._M_len = local_a8._M_string_length;
      local_58.piece_._M_str = local_a8._M_dataplus._M_p;
      local_88.piece_._M_len = 1;
      local_88.piece_._M_str = "\"";
      absl::lts_20250127::StrCat_abi_cxx11_
                (__return_storage_ptr__,(lts_20250127 *)&local_d8,&local_58,&local_88,in_R8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p == &local_a8.field_2) {
        return __return_storage_ptr__;
      }
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      return __return_storage_ptr__;
    }
    pcVar9 = *(char **)(this->field_20).default_value_enum_;
    this_00 = ((this->field_20).default_value_enum_)->all_names_;
    if (bVar1 == 0xc) {
      src_00._M_str._0_1_ = 0xc;
      src_00._M_len = (size_t)pcVar9;
      src_00._M_str._1_7_ = 0;
      absl::lts_20250127::CEscape_abi_cxx11_(__return_storage_ptr__,(lts_20250127 *)this_00,src_00);
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = (char *)((long)&(this_00->_M_dataplus)._M_p +
                     (long)&(((LogMessageData *)pcVar9)->entry).full_filename_);
    goto LAB_00392f0a;
  case 10:
    absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
              ((LogMessageDebugFatal *)&local_d8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
               ,0xc27);
    str._M_str = "Messages can\'t have default values!";
    str._M_len = 0x23;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&local_d8,str);
    absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
              ((LogMessageDebugFatal *)&local_d8);
  default:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_d8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
               ,0xc2a);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (&local_d8,(char (*) [54])"Can\'t get here: failed to get default value as string");
    goto LAB_003930a4;
  }
  pcVar9 = local_c8;
  local_d8._0_8_ = (long)pcVar7 - (long)pcVar9;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  local_d8.data_._M_t.
  super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  ._M_t.
  super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
  _M_head_impl = (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                  )(__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                    )pcVar9;
LAB_00392f0a:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar9,pcVar7);
  return __return_storage_ptr__;
}

Assistant:

std::string FieldDescriptor::DefaultValueAsString(
    bool quote_string_type) const {
  ABSL_CHECK(has_default_value()) << "No default value";
  switch (cpp_type()) {
    case CPPTYPE_INT32:
      return absl::StrCat(default_value_int32_t());
    case CPPTYPE_INT64:
      return absl::StrCat(default_value_int64_t());
    case CPPTYPE_UINT32:
      return absl::StrCat(default_value_uint32_t());
    case CPPTYPE_UINT64:
      return absl::StrCat(default_value_uint64_t());
    case CPPTYPE_FLOAT:
      return io::SimpleFtoa(default_value_float());
    case CPPTYPE_DOUBLE:
      return io::SimpleDtoa(default_value_double());
    case CPPTYPE_BOOL:
      return default_value_bool() ? "true" : "false";
    case CPPTYPE_STRING:
      if (quote_string_type) {
        return absl::StrCat("\"", absl::CEscape(default_value_string()), "\"");
      } else {
        if (type() == TYPE_BYTES) {
          return absl::CEscape(default_value_string());
        } else {
          return std::string(default_value_string());
        }
      }
    case CPPTYPE_ENUM:
      return std::string(default_value_enum()->name());
    case CPPTYPE_MESSAGE:
      ABSL_DLOG(FATAL) << "Messages can't have default values!";
      break;
  }
  ABSL_LOG(FATAL) << "Can't get here: failed to get default value as string";
  return "";
}